

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

shared_ptr<pstore::file::file_base> __thiscall
pstore::region::file_based_factory::file(file_based_factory *this)

{
  shared_ptr<pstore::file::file_base> sVar1;
  file_based_factory *this_local;
  
  sVar1 = std::static_pointer_cast<pstore::file::file_base,pstore::file::file_handle>
                    ((shared_ptr<pstore::file::file_handle> *)this);
  sVar1.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstore::file::file_base>)
         sVar1.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<file::file_base> file_based_factory::file () {
            return std::static_pointer_cast<file::file_base> (file_);
        }